

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseEmitter::onAttach(BaseEmitter *this,CodeHolder *code)

{
  Arch AVar1;
  OperandSignature *pOVar2;
  Arch local_9;
  
  this->_code = code;
  this->_environment = code->_environment;
  this->_emitterFlags = this->_emitterFlags | kAttached;
  AVar1 = (code->_environment)._arch;
  local_9 = AVar1 & k32BitMask ^ kThumb;
  pOVar2 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::operator[]<asmjit::v1_14::RegType>
                     ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                      (_archTraits + (ulong)AVar1 * 0xd8 + 0x14),&local_9);
  (this->_gpSignature)._bits = pOVar2->_bits;
  (*this->_vptr_BaseEmitter[0x12])(this);
  return 0;
}

Assistant:

Error BaseEmitter::onAttach(CodeHolder* code) noexcept {
  _code = code;
  _environment = code->environment();
  _addEmitterFlags(EmitterFlags::kAttached);

  const ArchTraits& archTraits = ArchTraits::byArch(code->arch());
  RegType nativeRegType = Environment::is32Bit(code->arch()) ? RegType::kGp32 : RegType::kGp64;
  _gpSignature = archTraits.regTypeToSignature(nativeRegType);

  onSettingsUpdated();
  return kErrorOk;
}